

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

Parsekey __thiscall
free_format_parser::HMpsFF::parseSos
          (HMpsFF *this,HighsLogOptions *log_options,istream *file,Parsekey keyword)

{
  HighsLogOptions *log_options_;
  bool bVar1;
  ulong uVar2;
  undefined8 uVar3;
  int in_ECX;
  HighsLogOptions *in_RSI;
  pair<int,_double> pVar4;
  bool is_nan;
  double weight;
  HighsInt colidx;
  string colname;
  string sosname;
  Parsekey key;
  string word_1;
  size_t end;
  size_t begin;
  bool skip;
  string word;
  string strline;
  string *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  string *in_stack_fffffffffffffdc8;
  istream *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  double in_stack_fffffffffffffdf8;
  HighsInt id;
  undefined4 in_stack_fffffffffffffe00;
  HighsInt in_stack_fffffffffffffe04;
  HMpsFF *in_stack_fffffffffffffe08;
  HMpsFF *in_stack_fffffffffffffe10;
  HighsLogOptions *in_stack_fffffffffffffe18;
  size_t in_stack_fffffffffffffe30;
  HighsLogOptions *in_stack_fffffffffffffe38;
  string local_168 [32];
  double local_148;
  HighsInt local_13c;
  string *in_stack_fffffffffffffec8;
  size_t *in_stack_fffffffffffffed0;
  size_t *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  HMpsFF *in_stack_fffffffffffffee8;
  Parsekey local_b4;
  string local_b0 [32];
  HMpsFF *local_90;
  int local_80;
  byte local_69;
  string local_68 [32];
  string local_48 [36];
  int local_24;
  HighsLogOptions *local_18;
  Parsekey local_4;
  
  local_24 = in_ECX;
  local_18 = in_RSI;
  std::__cxx11::string::string(local_48);
  std::__cxx11::string::string(local_68);
  while( true ) {
    do {
      bVar1 = getMpsLine((HMpsFF *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                         in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                         (bool *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      if (!bVar1) {
        local_4 = kFail;
        local_80 = 1;
        goto LAB_0046577a;
      }
    } while ((local_69 & 1) != 0);
    bVar1 = timeout((HMpsFF *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    if (bVar1) break;
    std::__cxx11::string::string(local_b0);
    local_b4 = checkFirstWord(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                              in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                              in_stack_fffffffffffffec8);
    if (local_b4 == kNone) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                              (char *)in_stack_fffffffffffffdb8);
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                  (char *)in_stack_fffffffffffffdb8), bVar1)) {
        first_word((string *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          std::__cxx11::string::operator[]((ulong)local_b0);
          std::vector<short,_std::allocator<short>_>::push_back
                    ((vector<short,_std::allocator<short>_> *)
                     CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (value_type_conflict4 *)in_stack_fffffffffffffdb8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
          std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
                    ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     0x465247);
          std::
          vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
          ::push_back((vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                      (value_type *)in_stack_fffffffffffffdb8);
          std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
                    ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     in_stack_fffffffffffffdd0);
          local_80 = 2;
        }
        else {
          highsLogUser(local_18,kError,"No name given for SOS\n");
          local_4 = kFail;
          local_80 = 1;
        }
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
      }
      else {
        bVar1 = std::
                vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                ::empty((vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                         *)in_stack_fffffffffffffdd0);
        if (bVar1) {
          trim((string *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               in_stack_fffffffffffffdb8);
          in_stack_fffffffffffffe38 = local_18;
          uVar3 = std::__cxx11::string::c_str();
          highsLogUser(in_stack_fffffffffffffe38,kError,
                       "SOS type specification missing before %s.\n",uVar3);
          local_4 = kFail;
          local_80 = 1;
        }
        else {
          std::__cxx11::string::string((string *)&stack0xfffffffffffffee8);
          if (local_24 == 0x13) {
            std::__cxx11::string::operator=((string *)&stack0xfffffffffffffee8,local_b0);
LAB_0046555b:
            in_stack_fffffffffffffe04 =
                 getColIdx(in_stack_fffffffffffffe08,
                           (string *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                           SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x38,0));
            local_148 = 0.0;
            local_13c = in_stack_fffffffffffffe04;
            bVar1 = is_end((string *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                           (size_t)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
            id = (HighsInt)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
            in_stack_fffffffffffffe00 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe00);
            if (!bVar1) {
              first_word((string *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
              std::__cxx11::string::operator=(local_b0,local_168);
              std::__cxx11::string::~string(local_168);
              in_stack_fffffffffffffdf8 =
                   getValue(in_stack_fffffffffffffe10,(string *)in_stack_fffffffffffffe08,
                            (bool *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),id
                           );
              local_148 = in_stack_fffffffffffffdf8;
            }
            in_stack_fffffffffffffdc8 =
                 (string *)
                 std::
                 vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                 ::back((vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
            pVar4 = std::make_pair<int&,double&>
                              ((int *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                               (double *)in_stack_fffffffffffffdb8);
            in_stack_fffffffffffffdd0 = (istream *)pVar4.second;
            in_stack_fffffffffffffddc = pVar4.first;
            std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
                      ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                       (value_type *)in_stack_fffffffffffffdb8);
            local_80 = 0;
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
            bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0)
                                    ,in_stack_fffffffffffffdb8);
            if (bVar1) {
              trim((string *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                   in_stack_fffffffffffffdb8);
              log_options_ = local_18;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
              in_stack_fffffffffffffe30 = std::__cxx11::string::c_str();
              uVar3 = std::__cxx11::string::c_str();
              highsLogUser(log_options_,kError,
                           "SOS specification for SOS %s mixed with SOS %s. This is currently not supported.\n"
                           ,in_stack_fffffffffffffe30,uVar3);
              local_4 = kFail;
              local_80 = 1;
            }
            else {
              bVar1 = is_end((string *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
                             ,(size_t)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
              if (!bVar1) {
                first_word((string *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
                in_stack_fffffffffffffe08 = (HMpsFF *)&stack0xfffffffffffffec8;
                std::__cxx11::string::operator=
                          ((string *)&stack0xfffffffffffffee8,(string *)in_stack_fffffffffffffe08);
                std::__cxx11::string::~string((string *)in_stack_fffffffffffffe08);
                in_stack_fffffffffffffe10 =
                     (HMpsFF *)
                     first_word_end((string *)in_stack_fffffffffffffe18,
                                    (size_t)in_stack_fffffffffffffe10);
                local_90 = in_stack_fffffffffffffe10;
                goto LAB_0046555b;
              }
              trim((string *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                   in_stack_fffffffffffffdb8);
              in_stack_fffffffffffffe18 = local_18;
              uVar3 = std::__cxx11::string::c_str();
              highsLogUser(in_stack_fffffffffffffe18,kError,
                           "Missing variable in SOS specification line %s.\n",uVar3);
              local_4 = kFail;
              local_80 = 1;
            }
          }
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
        }
      }
    }
    else {
      highsLogDev(local_18,kInfo,"readMPS: Read SETS    OK\n");
      local_4 = local_b4;
      local_80 = 1;
    }
    std::__cxx11::string::~string(local_b0);
    in_stack_fffffffffffffdc4 = local_80;
    if ((local_80 != 0) && (local_80 != 2)) {
LAB_0046577a:
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_48);
      return local_4;
    }
  }
  local_4 = kTimeout;
  local_80 = 1;
  goto LAB_0046577a;
}

Assistant:

typename HMpsFF::Parsekey HMpsFF::parseSos(const HighsLogOptions& log_options,
                                           std::istream& file,
                                           const HMpsFF::Parsekey keyword) {
  std::string strline, word;

  bool skip;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin, end;
    std::string word;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, word);

    if (key != Parsekey::kNone) {
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read SETS    OK\n");
      return key;
    }

    if (word == "S1" || word == "S2") {
      /* a new SOS is starting */
      std::string sosname = first_word(strline, end);

      if (sosname.empty()) {
        highsLogUser(log_options, HighsLogType::kError,
                     "No name given for SOS\n");
        return HMpsFF::Parsekey::kFail;
      }

      sos_type.push_back(word[1] == '1' ? 1 : 2);
      sos_name.push_back(sosname);
      sos_entries.push_back(std::vector<std::pair<HighsInt, double> >());
      continue;
    }

    /* a SOS is continuing
     * word is currently the column name and there may be a weight following
     */
    if (sos_entries.empty()) {
      trim(strline);
      highsLogUser(log_options, HighsLogType::kError,
                   "SOS type specification missing before %s.\n",
                   strline.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    std::string colname;

    if (keyword == HMpsFF::Parsekey::kSos) {
      // first word is column index
      colname = word;
    } else {
      // first word is SOS name, second word is colname, third word is weight
      // we expect SOS definitions to be contiguous for now
      if (word != sos_name.back()) {
        trim(word);
        highsLogUser(log_options, HighsLogType::kError,
                     "SOS specification for SOS %s mixed with SOS %s. This is "
                     "currently not supported.\n",
                     sos_name.back().c_str(), word.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      if (is_end(strline, end)) {
        trim(strline);
        highsLogUser(log_options, HighsLogType::kError,
                     "Missing variable in SOS specification line %s.\n",
                     strline.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      colname = first_word(strline, end);
      end = first_word_end(strline, end);
    }

    // colname -> colidx
    HighsInt colidx = getColIdx(colname);
    assert(colidx >= 0);
    assert(colidx < num_col);

    // last word is weight, allow to omit
    double weight = 0.0;
    if (!is_end(strline, end)) {
      word = first_word(strline, end);
      bool is_nan = false;
      weight = getValue(word, is_nan);  // atof(word.c_str());
      if (is_nan) {
        highsLogUser(log_options, HighsLogType::kError,
                     "Weight for column \"%s\" is NaN\n", colname.c_str());
        return HMpsFF::Parsekey::kFail;
      }
    }

    sos_entries.back().push_back(std::make_pair(colidx, weight));
  }

  return HMpsFF::Parsekey::kFail;
}